

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Battle.cpp
# Opt level: O2

void __thiscall Battle::enemyTurn(Battle *this)

{
  bool turnAgain;
  int y;
  int x;
  
  y = 1;
  turnAgain = true;
  x = y;
  do {
    Player::areaNavigate(this->enemy,&x,&y);
    Player::attack(this->enemy,this->player,x,y,&turnAgain);
  } while (turnAgain != false);
  return;
}

Assistant:

void Battle::enemyTurn() {
    int x = 1,y = 1;
    bool turnAgain = true;
    do {
        enemy->areaNavigate(x,y);
        enemy->attack(*player,x,y,turnAgain);
    } while (turnAgain);

}